

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_impl.hpp
# Opt level: O2

void __thiscall Catch::Matchers::Impl::StdString::EndsWith::~EndsWith(EndsWith *this)

{
  ~EndsWith(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Matchers::Impl::StdString::EndsWith::~EndsWith() {}